

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O1

FT_Error FT_Raccess_Get_HeaderInfo
                   (FT_Library library,FT_Stream stream,FT_Long rfork_offset,FT_Long *map_offset,
                   FT_Long *rdata_pos)

{
  bool bVar1;
  FT_UShort FVar2;
  FT_Error FVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  FT_Byte local_58 [8];
  uchar head2 [16];
  uchar head [16];
  FT_Error error;
  
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    bVar11 = (ulong)rfork_offset <= stream->size;
  }
  else {
    uVar4 = (*stream->read)(stream,rfork_offset,(uchar *)0x0,0);
    bVar11 = uVar4 == 0;
  }
  if (bVar11) {
    stream->pos = rfork_offset;
    head[0xc] = '\0';
    head[0xd] = '\0';
    head[0xe] = '\0';
    head[0xf] = '\0';
    head._12_4_ = FT_Stream_Read(stream,head2 + 8,0x10);
    if (head._12_4_ != 0) {
      return head._12_4_;
    }
    if (-1 < (char)(head2[8] | head2[0xc] | head[0] | head[4])) {
      uVar5 = (ulong)head2[0xb] |
              (ulong)((uint)head2[10] << 8 | (uint)head2[9] << 0x10 | (uint)head2[8] << 0x18);
      *rdata_pos = uVar5;
      uVar9 = (uint)head2[0xf] |
              (uint)head2[0xe] << 8 | (uint)head2[0xd] << 0x10 | (uint)head2[0xc] << 0x18;
      uVar10 = (ulong)uVar9;
      if (uVar9 != 0) {
        uVar6 = (ulong)head[3] |
                (ulong)((uint)head[2] << 8 | (uint)head[1] << 0x10 | (uint)head[0] << 0x18);
        uVar7 = (ulong)head[7] |
                (ulong)((uint)head[6] << 8 | (uint)head[5] << 0x10 | (uint)head[4] << 0x18);
        if ((uint)uVar5 < uVar9) {
          if ((long)uVar5 <= (long)(uVar10 - uVar6)) {
LAB_001f08a0:
            if ((rfork_offset <= (long)(uVar6 + uVar5 ^ 0x7fffffffffffffff)) &&
               (rfork_offset <= (long)(uVar7 + uVar10 ^ 0x7fffffffffffffff))) {
              if ((uVar6 + uVar5 + rfork_offset <= stream->size) &&
                 (uVar10 = uVar10 + rfork_offset, uVar7 + uVar10 <= stream->size)) {
                *rdata_pos = uVar5 + rfork_offset;
                if (stream->read == (FT_Stream_IoFunc)0x0) {
                  bVar11 = uVar10 <= stream->size;
                }
                else {
                  uVar4 = (*stream->read)(stream,uVar10,(uchar *)0x0,0);
                  bVar11 = uVar4 == 0;
                }
                if (!bVar11) goto LAB_001f09d5;
                stream->pos = uVar10;
                head[0xc] = '\0';
                head[0xd] = '\0';
                head[0xe] = '\0';
                head[0xf] = '\0';
                head2[7] = head[7] + '\x01';
                head._12_4_ = FT_Stream_Read(stream,local_58,0x10);
                if (head._12_4_ != 0) {
                  return head._12_4_;
                }
                bVar1 = true;
                lVar8 = 0;
                bVar11 = true;
                do {
                  if (local_58[lVar8] != '\0') {
                    bVar11 = false;
                  }
                  if (local_58[lVar8] != head2[lVar8 + 8]) {
                    bVar1 = false;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x10);
                if (bVar11 || bVar1) {
                  head._12_4_ = FT_Stream_Skip(stream,8);
                  FVar2 = FT_Stream_ReadUShort(stream,(FT_Error *)(head + 0xc));
                  if (head._12_4_ != 0) {
                    FVar3._0_1_ = head[0xc];
                    FVar3._1_1_ = head[0xd];
                    FVar3._2_1_ = head[0xe];
                    FVar3._3_1_ = head[0xf];
                    return FVar3;
                  }
                  if ((short)FVar2 < 0) {
                    return 2;
                  }
                  uVar10 = uVar10 + (long)(short)FVar2;
                  if (stream->read == (FT_Stream_IoFunc)0x0) {
                    bVar11 = uVar10 <= stream->size;
                  }
                  else {
                    uVar4 = (*stream->read)(stream,uVar10,(uchar *)0x0,0);
                    bVar11 = uVar4 == 0;
                  }
                  if (!bVar11) {
                    return 0x55;
                  }
                  stream->pos = uVar10;
                  *map_offset = uVar10;
                  return 0;
                }
              }
            }
          }
        }
        else if ((long)uVar10 <= (long)(uVar5 - uVar7)) goto LAB_001f08a0;
      }
    }
    FVar3 = 2;
  }
  else {
LAB_001f09d5:
    FVar3 = 0x55;
  }
  return FVar3;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_HeaderInfo( FT_Library  library,
                             FT_Stream   stream,
                             FT_Long     rfork_offset,
                             FT_Long    *map_offset,
                             FT_Long    *rdata_pos )
  {
    FT_Error       error;
    unsigned char  head[16], head2[16];
    FT_Long        map_pos, map_len, rdata_len;
    int            allzeros, allmatch, i;
    FT_Long        type_list;

    FT_UNUSED( library );


    error = FT_Stream_Seek( stream, (FT_ULong)rfork_offset );
    if ( error )
      return error;

    error = FT_Stream_Read( stream, (FT_Byte*)head, 16 );
    if ( error )
      return error;

    /* ensure positive values */
    if ( head[0]  >= 0x80 ||
         head[4]  >= 0x80 ||
         head[8]  >= 0x80 ||
         head[12] >= 0x80 )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos = ( head[ 0] << 24 ) |
                 ( head[ 1] << 16 ) |
                 ( head[ 2] <<  8 ) |
                   head[ 3];
    map_pos    = ( head[ 4] << 24 ) |
                 ( head[ 5] << 16 ) |
                 ( head[ 6] <<  8 ) |
                   head[ 7];
    rdata_len  = ( head[ 8] << 24 ) |
                 ( head[ 9] << 16 ) |
                 ( head[10] <<  8 ) |
                   head[11];
    map_len    = ( head[12] << 24 ) |
                 ( head[13] << 16 ) |
                 ( head[14] <<  8 ) |
                   head[15];

    /* the map must not be empty */
    if ( !map_pos )
      return FT_THROW( Unknown_File_Format );

    /* check whether rdata and map overlap */
    if ( *rdata_pos < map_pos )
    {
      if ( *rdata_pos > map_pos - rdata_len )
        return FT_THROW( Unknown_File_Format );
    }
    else
    {
      if ( map_pos > *rdata_pos - map_len )
        return FT_THROW( Unknown_File_Format );
    }

    /* check whether end of rdata or map exceeds stream size */
    if ( FT_LONG_MAX - rdata_len < *rdata_pos                               ||
         FT_LONG_MAX - map_len < map_pos                                    ||

         FT_LONG_MAX - ( *rdata_pos + rdata_len ) < rfork_offset            ||
         FT_LONG_MAX - ( map_pos + map_len ) < rfork_offset                 ||

         (FT_ULong)( rfork_offset + *rdata_pos + rdata_len ) > stream->size ||
         (FT_ULong)( rfork_offset + map_pos + map_len ) > stream->size      )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos += rfork_offset;
    map_pos    += rfork_offset;

    error = FT_Stream_Seek( stream, (FT_ULong)map_pos );
    if ( error )
      return error;

    head2[15] = (FT_Byte)( head[15] + 1 );       /* make it be different */

    error = FT_Stream_Read( stream, (FT_Byte*)head2, 16 );
    if ( error )
      return error;

    allzeros = 1;
    allmatch = 1;
    for ( i = 0; i < 16; i++ )
    {
      if ( head2[i] != 0 )
        allzeros = 0;
      if ( head2[i] != head[i] )
        allmatch = 0;
    }
    if ( !allzeros && !allmatch )
      return FT_THROW( Unknown_File_Format );

    /* If we have reached this point then it is probably a mac resource */
    /* file.  Now, does it contain any interesting resources?           */

    (void)FT_STREAM_SKIP( 4        /* skip handle to next resource map */
                          + 2      /* skip file resource number */
                          + 2 );   /* skip attributes */

    if ( FT_READ_SHORT( type_list ) )
      return error;
    if ( type_list < 0 )
      return FT_THROW( Unknown_File_Format );

    error = FT_Stream_Seek( stream, (FT_ULong)( map_pos + type_list ) );
    if ( error )
      return error;

    *map_offset = map_pos + type_list;
    return FT_Err_Ok;
  }